

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cpp
# Opt level: O2

value * json::parse(string *input)

{
  bool bVar1;
  int iVar2;
  object *poVar3;
  string *psVar4;
  size_type sVar5;
  allocator<char> local_59;
  Pig n;
  string local_38;
  
  Pig::Pig(&n,input);
  Pig::skipWS(&n);
  iVar2 = Pig::peek(&n);
  if (iVar2 == 0x7b) {
    poVar3 = object::parse(&n);
  }
  else {
    iVar2 = Pig::peek(&n);
    if (iVar2 != 0x5b) {
      psVar4 = (string *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"Error: expected \'{\' or \'[\' at position {1}",&local_59);
      sVar5 = Pig::cursor(&n);
      format<int>(psVar4,&local_38,(int)sVar5);
      __cxa_throw(psVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    poVar3 = (object *)array::parse(&n);
  }
  Pig::skipWS(&n);
  bVar1 = Pig::eos(&n);
  if (bVar1) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&n._text.
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    return &poVar3->super_value;
  }
  if (poVar3 != (object *)0x0) {
    (*(poVar3->super_value)._vptr_value[1])(poVar3);
  }
  psVar4 = (string *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Error: extra characters found at position {1}",&local_59);
  sVar5 = Pig::cursor(&n);
  format<int>(psVar4,&local_38,(int)sVar5);
  __cxa_throw(psVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

json::value* json::parse (const std::string& input)
{
  json::value* root = nullptr;

  Pig n (input);
  n.skipWS ();

       if (n.peek () == '{') root = json::object::parse (n);
  else if (n.peek () == '[') root = json::array::parse (n);
  else
    throw format ("Error: expected '{' or '[' at position {1}", (int) n.cursor ());

  // Check for end condition.
  n.skipWS ();
  if (!n.eos ())
  {
    delete root;
    throw format ("Error: extra characters found at position {1}", (int) n.cursor ());
  }

  return root;
}